

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorPool::Tables::RollbackToLastCheckpoint
          (Tables *this,DeferredValidation *deferred_validation)

{
  DeferredValidation *this_00;
  bool bVar1;
  LogMessage *pLVar2;
  reference pvVar3;
  size_type sVar4;
  reference key;
  reference ppFVar5;
  reference key_00;
  ulong local_68;
  size_t i_2;
  size_t i_1;
  size_t i;
  CheckPoint *checkpoint;
  LogMessage local_30;
  Voidify local_19;
  DeferredValidation *local_18;
  DeferredValidation *deferred_validation_local;
  Tables *this_local;
  
  local_18 = deferred_validation;
  deferred_validation_local = (DeferredValidation *)this;
  bVar1 = std::
          vector<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
          ::empty(&this->checkpoints_);
  if (!bVar1) {
    pvVar3 = std::
             vector<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
             ::back(&this->checkpoints_);
    for (i_1 = (size_t)pvVar3->pending_symbols_before_checkpoint;
        sVar4 = std::vector<google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>_>::
                size(&this->symbols_after_checkpoint_), i_1 < sVar4; i_1 = i_1 + 1) {
      key = std::vector<google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>_>::
            operator[](&this->symbols_after_checkpoint_,i_1);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
      ::erase<google::protobuf::Symbol>
                (&(this->symbols_by_name_).
                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                 ,key);
    }
    for (i_2 = (size_t)pvVar3->pending_files_before_checkpoint;
        sVar4 = std::
                vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::size(&this->files_after_checkpoint_), this_00 = local_18, i_2 < sVar4;
        i_2 = i_2 + 1) {
      ppFVar5 = std::
                vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::operator[](&this->files_after_checkpoint_,i_2);
      DeferredValidation::RollbackFile(this_00,*ppFVar5);
      ppFVar5 = std::
                vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::operator[](&this->files_after_checkpoint_,i_2);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,std::allocator<google::protobuf::FileDescriptor_const*>>
      ::erase<google::protobuf::FileDescriptor_const*>
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,std::allocator<google::protobuf::FileDescriptor_const*>>
                  *)&this->files_by_name_,ppFVar5);
    }
    for (local_68 = (ulong)pvVar3->pending_extensions_before_checkpoint;
        sVar4 = std::
                vector<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
                ::size(&this->extensions_after_checkpoint_), local_68 < sVar4;
        local_68 = local_68 + 1) {
      key_00 = std::
               vector<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
               ::operator[](&this->extensions_after_checkpoint_,local_68);
      absl::lts_20250127::container_internal::
      btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::pair<google::protobuf::Descriptor_const*,int>,google::protobuf::FieldDescriptor_const*,std::less<std::pair<google::protobuf::Descriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::Descriptor_const*,int>const,google::protobuf::FieldDescriptor_const*>>,256,false>>>
      ::erase<std::pair<google::protobuf::Descriptor_const*,int>>
                ((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::pair<google::protobuf::Descriptor_const*,int>,google::protobuf::FieldDescriptor_const*,std::less<std::pair<google::protobuf::Descriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::Descriptor_const*,int>const,google::protobuf::FieldDescriptor_const*>>,256,false>>>
                  *)&this->extensions_,key_00);
    }
    std::vector<google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>_>::resize
              (&this->symbols_after_checkpoint_,(long)pvVar3->pending_symbols_before_checkpoint);
    std::
    vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::resize(&this->files_after_checkpoint_,(long)pvVar3->pending_files_before_checkpoint);
    std::
    vector<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
    ::resize(&this->extensions_after_checkpoint_,(long)pvVar3->pending_extensions_before_checkpoint)
    ;
    std::
    vector<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
    ::resize(&this->flat_allocs_,(long)pvVar3->flat_allocations_before_checkpoint);
    std::
    vector<std::unique_ptr<int,_google::protobuf::DescriptorPool::Tables::MiscDeleter>,_std::allocator<std::unique_ptr<int,_google::protobuf::DescriptorPool::Tables::MiscDeleter>_>_>
    ::resize(&this->misc_allocs_,(long)pvVar3->misc_allocations_before_checkpoint);
    std::
    vector<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
    ::pop_back(&this->checkpoints_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
             ,0x780,"!checkpoints_.empty()");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

void DescriptorPool::Tables::RollbackToLastCheckpoint(
    DeferredValidation& deferred_validation) {
  ABSL_DCHECK(!checkpoints_.empty());
  const CheckPoint& checkpoint = checkpoints_.back();

  for (size_t i = checkpoint.pending_symbols_before_checkpoint;
       i < symbols_after_checkpoint_.size(); i++) {
    symbols_by_name_.erase(symbols_after_checkpoint_[i]);
  }
  for (size_t i = checkpoint.pending_files_before_checkpoint;
       i < files_after_checkpoint_.size(); i++) {
    deferred_validation.RollbackFile(files_after_checkpoint_[i]);
    files_by_name_.erase(files_after_checkpoint_[i]);
  }
  for (size_t i = checkpoint.pending_extensions_before_checkpoint;
       i < extensions_after_checkpoint_.size(); i++) {
    extensions_.erase(extensions_after_checkpoint_[i]);
  }

  symbols_after_checkpoint_.resize(
      checkpoint.pending_symbols_before_checkpoint);
  files_after_checkpoint_.resize(checkpoint.pending_files_before_checkpoint);
  extensions_after_checkpoint_.resize(
      checkpoint.pending_extensions_before_checkpoint);

  flat_allocs_.resize(checkpoint.flat_allocations_before_checkpoint);
  misc_allocs_.resize(checkpoint.misc_allocations_before_checkpoint);
  checkpoints_.pop_back();
}